

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbm-xs.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  uint __line;
  ulong uVar1;
  char *__assertion;
  kbm loaded_kbm;
  ifstream test_kbm;
  
  std::ifstream::ifstream(&test_kbm);
  std::ifstream::open((char *)&test_kbm,0x126010);
  scala::read_kbm(&loaded_kbm,&test_kbm);
  if (loaded_kbm.map_size == 0xc) {
    if (loaded_kbm.first_note == 0) {
      if (loaded_kbm.last_note == 0x7f) {
        if (loaded_kbm.middle_note == 0x3c) {
          if (loaded_kbm.reference_note == 0x45) {
            if ((loaded_kbm.reference_frequency != 440.0) || (NAN(loaded_kbm.reference_frequency)))
            {
              __assertion = "loaded_kbm.reference_frequency == 440.0";
              __line = 0x1a;
            }
            else {
              if (loaded_kbm.octave_degree == 0xc) {
                uVar1 = 0;
                do {
                  if (uVar1 == 0xc) {
                    std::ifstream::close();
                    scala::kbm::~kbm(&loaded_kbm);
                    std::ifstream::~ifstream(&test_kbm);
                    return 0;
                  }
                  if ((uVar1 & 1) == 0) {
                    if (uVar1 != (long)loaded_kbm.mapping.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start[uVar1]) {
                      __assertion = "loaded_kbm.mapping[i] == i";
                      __line = 0x1f;
                      goto LAB_001196d9;
                    }
                  }
                  else if (loaded_kbm.mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar1] != -1) {
                    __assertion = "loaded_kbm.mapping[i] == KBM_NON_ENTRY";
                    __line = 0x21;
                    goto LAB_001196d9;
                  }
                  uVar1 = uVar1 + 1;
                } while( true );
              }
              __assertion = "loaded_kbm.octave_degree == 12";
              __line = 0x1b;
            }
          }
          else {
            __assertion = "loaded_kbm.reference_note == 69";
            __line = 0x19;
          }
        }
        else {
          __assertion = "loaded_kbm.middle_note == 60";
          __line = 0x18;
        }
      }
      else {
        __assertion = "loaded_kbm.last_note == 127";
        __line = 0x17;
      }
    }
    else {
      __assertion = "loaded_kbm.first_note == 0";
      __line = 0x16;
    }
  }
  else {
    __assertion = "loaded_kbm.map_size == 12";
    __line = 0x15;
  }
LAB_001196d9:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/kbm-xs.cpp"
                ,__line,"int main(int, char **)");
}

Assistant:

int main(int, char**) {
  ifstream test_kbm; 
  test_kbm.open("kbm/12-tet-xs.kbm");
  scala::kbm loaded_kbm = scala::read_kbm(test_kbm);

  /*
    This test ensures that x's are honored in the KBM 
    file.
  */

  assert(loaded_kbm.map_size == 12);
  assert(loaded_kbm.first_note == 0);
  assert(loaded_kbm.last_note == 127);
  assert(loaded_kbm.middle_note == 60);
  assert(loaded_kbm.reference_note == 69);
  assert(loaded_kbm.reference_frequency == 440.0);
  assert(loaded_kbm.octave_degree == 12);

  for (size_t i = 0; i < 12; i++){
    if (i % 2 == 0){
      assert(loaded_kbm.mapping[i] == i);
    } else {
      assert(loaded_kbm.mapping[i] == KBM_NON_ENTRY);
    }
  }

  test_kbm.close();
  return 0;
}